

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.cpp
# Opt level: O0

DiffLine *
init_diff_line(DiffLine *__return_storage_ptr__,StatusEnum status_enum,int line_number,string *line)

{
  string *line_local;
  int line_number_local;
  StatusEnum status_enum_local;
  DiffLine *diff_line;
  
  DiffLine::DiffLine(__return_storage_ptr__);
  __return_storage_ptr__->status_enum = status_enum;
  __return_storage_ptr__->line_number = line_number;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->line,(string *)line);
  return __return_storage_ptr__;
}

Assistant:

DiffLine init_diff_line(StatusEnum status_enum,int line_number, String line){
    DiffLine diff_line;
    diff_line.status_enum = status_enum;
    diff_line.line_number = line_number;
    diff_line.line = line;
    return diff_line;
}